

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cd03::XmlTestReporterFixtureFailureMessageIsXMLEscapedHelper::RunImpl
          (XmlTestReporterFixtureFailureMessageIsXMLEscapedHelper *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char *local_38;
  char *expected;
  TestDetails details;
  XmlTestReporterFixtureFailureMessageIsXMLEscapedHelper *this_local;
  
  details._24_8_ = this;
  UnitTest::TestDetails::TestDetails
            ((TestDetails *)&expected,"TestName","suite","filename.h",0x10e1);
  UnitTest::DeferredTestReporter::ReportTestStart
            (&(this->super_XmlTestReporterFixture).reporter.super_DeferredTestReporter,
             (TestDetails *)&expected);
  UnitTest::DeferredTestReporter::ReportFailure
            (&(this->super_XmlTestReporterFixture).reporter.super_DeferredTestReporter,
             (TestDetails *)&expected,"\"\'&<>");
  UnitTest::DeferredTestReporter::ReportTestFinish
            (&(this->super_XmlTestReporterFixture).reporter.super_DeferredTestReporter,
             (TestDetails *)&expected,0.1);
  UnitTest::XmlTestReporter::ReportSummary(&(this->super_XmlTestReporterFixture).reporter,1,1,1,0.1)
  ;
  local_38 = 
  "<?xml version=\"1.0\"?><unittest-results tests=\"1\" failedtests=\"1\" failures=\"1\" time=\"0.1\"><test suite=\"suite\" name=\"TestName\" time=\"0.1\"><failure message=\"filename.h(4321) : &quot;&apos;&amp;&lt;&gt;\"/></test></unittest-results>"
  ;
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  std::__cxx11::ostringstream::str();
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_88,*ppTVar2,0x84);
  UnitTest::CheckEqual<char_const*,std::__cxx11::string>(results,&local_38,&local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, FailureMessageIsXMLEscaped)
{
    TestDetails const details("TestName", "suite", "filename.h", 4321);

    reporter.ReportTestStart(details);
    reporter.ReportFailure(details, "\"\'&<>");
    reporter.ReportTestFinish(details, 0.1f);
    reporter.ReportSummary(1, 1, 1, 0.1f);

    char const* expected =
        "<?xml version=\"1.0\"?>"
        "<unittest-results tests=\"1\" failedtests=\"1\" failures=\"1\" time=\"0.1\">"
        "<test suite=\"suite\" name=\"TestName\" time=\"0.1\">"
        "<failure message=\"filename.h(4321) : &quot;&apos;&amp;&lt;&gt;\"/>"
        "</test>"
        "</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}